

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTransport.h
# Opt level: O2

uint32_t __thiscall
duckdb_apache::thrift::transport::readAll<duckdb::ThriftFileTransport>
          (transport *this,ThriftFileTransport *trans,uint8_t *buf,uint32_t len)

{
  uint32_t get;
  ssize_t sVar1;
  TTransportException *this_00;
  undefined4 in_register_0000000c;
  uint uVar2;
  uint uVar3;
  allocator local_41;
  string local_40;
  
  uVar3 = 0;
  do {
    uVar2 = (uint)buf - uVar3;
    if ((uint)buf < uVar3 || uVar2 == 0) {
      return uVar3;
    }
    sVar1 = duckdb::ThriftFileTransport::read
                      ((ThriftFileTransport *)this,uVar3 + (int)trans,(void *)(ulong)uVar2,
                       CONCAT44(in_register_0000000c,len));
    uVar3 = uVar3 + (int)sVar1;
  } while ((int)sVar1 != 0);
  this_00 = (TTransportException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_40,"No more data to read.",&local_41);
  TTransportException::TTransportException(this_00,END_OF_FILE,&local_40);
  __cxa_throw(this_00,&TTransportException::typeinfo,TException::~TException);
}

Assistant:

uint32_t readAll(Transport_& trans, uint8_t* buf, uint32_t len) {
  uint32_t have = 0;
  uint32_t get = 0;

  while (have < len) {
    get = trans.read(buf + have, len - have);
    if (get <= 0) {
      throw TTransportException(TTransportException::END_OF_FILE, "No more data to read.");
    }
    have += get;
  }

  return have;
}